

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

void ssh_throttle_conn(Ssh *ssh,int adjust)

{
  int iVar1;
  _Bool local_19;
  _Bool frozen;
  int old_count;
  int adjust_local;
  Ssh *ssh_local;
  
  iVar1 = ssh->conn_throttle_count;
  ssh->conn_throttle_count = adjust + ssh->conn_throttle_count;
  if (ssh->conn_throttle_count < 0) {
    __assert_fail("ssh->conn_throttle_count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/ssh.c",
                  0x370,"void ssh_throttle_conn(Ssh *, int)");
  }
  if ((ssh->conn_throttle_count == 0) || (iVar1 != 0)) {
    if (ssh->conn_throttle_count != 0) {
      return;
    }
    if (iVar1 == 0) {
      return;
    }
    local_19 = false;
  }
  else {
    local_19 = true;
  }
  ssh->logically_frozen = local_19;
  ssh_check_frozen(ssh);
  return;
}

Assistant:

void ssh_throttle_conn(Ssh *ssh, int adjust)
{
    int old_count = ssh->conn_throttle_count;
    bool frozen;

    ssh->conn_throttle_count += adjust;
    assert(ssh->conn_throttle_count >= 0);

    if (ssh->conn_throttle_count && !old_count) {
        frozen = true;
    } else if (!ssh->conn_throttle_count && old_count) {
        frozen = false;
    } else {
        return;                /* don't change current frozen state */
    }

    ssh->logically_frozen = frozen;
    ssh_check_frozen(ssh);
}